

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

HANDLE OpenFileMappingW(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName)

{
  CPalThread *pThread;
  PAL_ERROR palError;
  HANDLE hFileMapping;
  LPCWSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpName == (LPCWSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pThread._4_4_ = 0x57;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","OpenFileMappingW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x34a);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    pThread._4_4_ = 0x32;
  }
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (HANDLE)0x0;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
OpenFileMappingW(
         IN DWORD dwDesiredAccess,
         IN BOOL bInheritHandle,
         IN LPCWSTR lpName)
{
    HANDLE hFileMapping = NULL;
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    
    PERF_ENTRY(OpenFileMappingW);
    ENTRY("OpenFileMappingW(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%S)\n",
          dwDesiredAccess, bInheritHandle, lpName?lpName:W16_NULLSTRING, lpName?lpName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    LOGEXIT("OpenFileMappingW returning %p.\n", hFileMapping);
    PERF_EXIT(OpenFileMappingW);
    return hFileMapping;
}